

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.cc
# Opt level: O1

void __thiscall
iqxmlrpc::Http_client_connection::handle_input(Http_client_connection *this,bool *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Reactor_base *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  Packet *pPVar5;
  network_error *this_00;
  long lVar6;
  pointer pcVar7;
  string local_50;
  long lVar4;
  
  pcVar7 = (this->super_Client_connection).read_buf_.super__Vector_base<char,_std::allocator<char>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->super_Client_connection).read_buf_.
                super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pcVar7;
  paVar1 = &local_50.field_2;
  do {
    if (this->resp_packet != (Packet *)0x0) break;
    iVar3 = (*(this->super_Connection).super_Event_handler._vptr_Event_handler[0xd])
                      (&this->super_Connection,pcVar7,lVar6);
    lVar4 = CONCAT44(extraout_var,iVar3);
    if (lVar4 == 0) {
      this_00 = (network_error *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Connection closed by peer.","");
      iqnet::network_error::network_error(this_00,&local_50,false,0);
      __cxa_throw(this_00,&iqnet::network_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar7 = (this->super_Client_connection).read_buf_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar7,pcVar7 + lVar4);
    pPVar5 = Client_connection::read_response(&this->super_Client_connection,&local_50,false);
    this->resp_packet = pPVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pcVar7 = (this->super_Client_connection).read_buf_.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar6 = (long)(this->super_Client_connection).read_buf_.
                  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)pcVar7;
  } while (lVar4 == lVar6);
  if (this->resp_packet != (Packet *)0x0) {
    pRVar2 = (this->reactor)._M_ptr;
    (*pRVar2->_vptr_Reactor_base[4])(pRVar2,&this->super_Connection);
  }
  return;
}

Assistant:

void Http_client_connection::handle_input( bool& )
{
  for( size_t sz = read_buf_sz(); (sz == read_buf_sz()) && !resp_packet ; )
  {
    if( !(sz = recv( read_buf(), read_buf_sz() )) )
      throw iqnet::network_error( "Connection closed by peer.", false );

    resp_packet = read_response( std::string(read_buf(), sz) );
  }

  if( resp_packet )
    reactor->unregister_handler( this );
}